

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

Element * __thiscall Rml::Element::GetClosestScrollableContainer(Element *this)

{
  Vector2f VVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float local_38;
  
  do {
    uVar4 = (uint)*(undefined8 *)&(this->meta->computed_values).common;
    if ((uVar4 >> 0xb & 1) == 0) {
      bVar2 = false;
    }
    else {
      fVar6 = (this->scrollable_overflow_rectangle).x;
      VVar1 = Box::GetSize(&this->main_box,Padding);
      fVar5 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
      local_38 = VVar1.x;
      if (fVar6 <= local_38 - fVar5) {
        fVar6 = local_38 - fVar5;
      }
      VVar1 = Box::GetSize(&this->main_box,Padding);
      fVar5 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
      local_38 = VVar1.x;
      bVar2 = local_38 - fVar5 < fVar6;
    }
    if ((uVar4 >> 0xd & 1) == 0) {
      bVar3 = false;
    }
    else {
      fVar6 = (this->scrollable_overflow_rectangle).y;
      VVar1 = Box::GetSize(&this->main_box,Padding);
      fVar5 = ElementScroll::GetScrollbarSize(&this->meta->scroll,HORIZONTAL);
      fVar5 = VVar1.y - fVar5;
      if (fVar6 <= fVar5) {
        fVar6 = fVar5;
      }
      VVar1 = Box::GetSize(&this->main_box,Padding);
      fVar5 = ElementScroll::GetScrollbarSize(&this->meta->scroll,HORIZONTAL);
      bVar3 = VVar1.y - fVar5 < fVar6;
    }
    if (bVar2 || bVar3) {
      return this;
    }
    if (((this->meta->computed_values).rare.field_0x3 & 1) != 0) {
      return this;
    }
    this = this->parent;
  } while (this != (Element *)0x0);
  return (Element *)0x0;
}

Assistant:

Element* Element::GetClosestScrollableContainer()
{
	using namespace Style;

	Overflow overflow_x = meta->computed_values.overflow_x();
	Overflow overflow_y = meta->computed_values.overflow_y();
	bool scrollable_x = (overflow_x == Overflow::Auto || overflow_x == Overflow::Scroll);
	bool scrollable_y = (overflow_y == Overflow::Auto || overflow_y == Overflow::Scroll);

	scrollable_x = (scrollable_x && GetScrollWidth() > GetClientWidth());
	scrollable_y = (scrollable_y && GetScrollHeight() > GetClientHeight());

	if (scrollable_x || scrollable_y || meta->computed_values.overscroll_behavior() == OverscrollBehavior::Contain)
		return this;
	else if (parent)
		return parent->GetClosestScrollableContainer();

	return nullptr;
}